

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

CURLcode glob_next_url(char **globbed,URLGlob *glob)

{
  URLPatternType UVar1;
  bool bVar2;
  int iVar3;
  URLPattern *pUVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  char *pcStack_48;
  _Bool carry;
  char *buf;
  size_t buflen;
  size_t len;
  size_t i;
  URLPattern *pat;
  URLGlob *glob_local;
  char **globbed_local;
  
  buf = (char *)(glob->urllen + 1);
  pcStack_48 = glob->glob_buffer;
  *globbed = (char *)0x0;
  if (glob->beenhere == '\0') {
    glob->beenhere = '\x01';
  }
  else {
    bVar2 = true;
    len = 0;
    while( true ) {
      bVar7 = false;
      if (bVar2) {
        bVar7 = len < glob->size;
      }
      if (!bVar7) break;
      bVar2 = false;
      pUVar4 = glob->pattern + ~len + glob->size;
      UVar1 = pUVar4->type;
      if (UVar1 == UPTSet) {
        if (((pUVar4->content).Set.elements != (char **)0x0) &&
           (iVar3 = (pUVar4->content).Set.ptr_s + 1, (pUVar4->content).Set.ptr_s = iVar3,
           iVar3 == (pUVar4->content).Set.size)) {
          (pUVar4->content).Set.ptr_s = 0;
          bVar2 = true;
        }
      }
      else if (UVar1 == UPTCharRange) {
        (pUVar4->content).CharRange.ptr_c =
             (char)(pUVar4->content).CharRange.step + (pUVar4->content).CharRange.ptr_c;
        bVar2 = (pUVar4->content).CharRange.max_c < (pUVar4->content).CharRange.ptr_c;
        if (bVar2) {
          (pUVar4->content).CharRange.ptr_c = (pUVar4->content).CharRange.min_c;
        }
      }
      else {
        if (UVar1 != UPTNumRange) {
          curl_mprintf("internal error: invalid pattern type (%d)\n",pUVar4->type);
          return CURLE_FAILED_INIT;
        }
        (pUVar4->content).NumRange.ptr_n =
             (pUVar4->content).NumRange.step + (pUVar4->content).NumRange.ptr_n;
        bVar2 = (pUVar4->content).NumRange.max_n < (pUVar4->content).NumRange.ptr_n;
        if (bVar2) {
          (pUVar4->content).NumRange.ptr_n = (unsigned_long)(pUVar4->content).Set.elements;
        }
      }
      len = len + 1;
    }
    if (bVar2) {
      return CURLE_OK;
    }
  }
  len = 0;
  do {
    if (glob->size <= len) {
      pcVar6 = strdup(glob->glob_buffer);
      *globbed = pcVar6;
      if (*globbed == (char *)0x0) {
        globbed_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        globbed_local._4_4_ = CURLE_OK;
      }
      return globbed_local._4_4_;
    }
    pUVar4 = glob->pattern + len;
    UVar1 = pUVar4->type;
    if (UVar1 == UPTSet) {
      if ((pUVar4->content).Set.elements != (char **)0x0) {
        curl_msnprintf(pcStack_48,buf,"%s",
                       (pUVar4->content).Set.elements[(pUVar4->content).Set.ptr_s]);
        sVar5 = strlen(pcStack_48);
        buf = buf + -sVar5;
        pcStack_48 = pcStack_48 + sVar5;
      }
    }
    else if (UVar1 == UPTCharRange) {
      if (buf != (char *)0x0) {
        *pcStack_48 = (pUVar4->content).CharRange.ptr_c;
        pcStack_48[1] = '\0';
        buf = buf + -1;
        pcStack_48 = pcStack_48 + 1;
      }
    }
    else {
      if (UVar1 != UPTNumRange) {
        curl_mprintf("internal error: invalid pattern type (%d)\n",pUVar4->type);
        return CURLE_FAILED_INIT;
      }
      curl_msnprintf(pcStack_48,buf,"%0*lu",(pUVar4->content).NumRange.padlength,
                     (pUVar4->content).NumRange.ptr_n);
      sVar5 = strlen(pcStack_48);
      buf = buf + -sVar5;
      pcStack_48 = pcStack_48 + sVar5;
    }
    len = len + 1;
  } while( true );
}

Assistant:

CURLcode glob_next_url(char **globbed, URLGlob *glob)
{
  URLPattern *pat;
  size_t i;
  size_t len;
  size_t buflen = glob->urllen + 1;
  char *buf = glob->glob_buffer;

  *globbed = NULL;

  if(!glob->beenhere)
    glob->beenhere = 1;
  else {
    bool carry = TRUE;

    /* implement a counter over the index ranges of all patterns, starting
       with the rightmost pattern */
    for(i = 0; carry && (i < glob->size); i++) {
      carry = FALSE;
      pat = &glob->pattern[glob->size - 1 - i];
      switch(pat->type) {
      case UPTSet:
        if((pat->content.Set.elements) &&
           (++pat->content.Set.ptr_s == pat->content.Set.size)) {
          pat->content.Set.ptr_s = 0;
          carry = TRUE;
        }
        break;
      case UPTCharRange:
        pat->content.CharRange.ptr_c =
          (char)(pat->content.CharRange.step +
                 (int)((unsigned char)pat->content.CharRange.ptr_c));
        if(pat->content.CharRange.ptr_c > pat->content.CharRange.max_c) {
          pat->content.CharRange.ptr_c = pat->content.CharRange.min_c;
          carry = TRUE;
        }
        break;
      case UPTNumRange:
        pat->content.NumRange.ptr_n += pat->content.NumRange.step;
        if(pat->content.NumRange.ptr_n > pat->content.NumRange.max_n) {
          pat->content.NumRange.ptr_n = pat->content.NumRange.min_n;
          carry = TRUE;
        }
        break;
      default:
        printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
        return CURLE_FAILED_INIT;
      }
    }
    if(carry) {         /* first pattern ptr has run into overflow, done! */
      return CURLE_OK;
    }
  }

  for(i = 0; i < glob->size; ++i) {
    pat = &glob->pattern[i];
    switch(pat->type) {
    case UPTSet:
      if(pat->content.Set.elements) {
        msnprintf(buf, buflen, "%s",
                  pat->content.Set.elements[pat->content.Set.ptr_s]);
        len = strlen(buf);
        buf += len;
        buflen -= len;
      }
      break;
    case UPTCharRange:
      if(buflen) {
        *buf++ = pat->content.CharRange.ptr_c;
        *buf = '\0';
        buflen--;
      }
      break;
    case UPTNumRange:
      msnprintf(buf, buflen, "%0*lu",
                pat->content.NumRange.padlength,
                pat->content.NumRange.ptr_n);
      len = strlen(buf);
      buf += len;
      buflen -= len;
      break;
    default:
      printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
      return CURLE_FAILED_INIT;
    }
  }

  *globbed = strdup(glob->glob_buffer);
  if(!*globbed)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}